

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O3

int __thiscall NetQuantize::quantize_convolution(NetQuantize *this)

{
  pointer *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  pointer __ptr;
  _Base_ptr p_Var5;
  long *plVar6;
  int *piVar7;
  pointer piVar8;
  pointer pMVar9;
  pointer __ptr_00;
  long *plVar10;
  ulong uVar11;
  bool bVar12;
  int iVar13;
  iterator iVar14;
  size_t sVar15;
  iterator iVar16;
  ulong uVar17;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *this_01;
  uint uVar18;
  Option opt_q;
  char key [256];
  undefined1 local_2e8 [32];
  Allocator *local_2c8;
  int local_2c0;
  int iStack_2bc;
  int iStack_2b8;
  int iStack_2b4;
  int local_2b0;
  pointer local_2a8;
  undefined8 local_2a0;
  pointer local_298;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_290;
  Option *local_288;
  _Base_ptr local_280;
  _Base_ptr local_278;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_270;
  Mat local_268;
  Mat local_220;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  Option local_1c8;
  Mat local_180;
  char local_138 [264];
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar18 = (uint)((ulong)((long)(pvVar3->
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar3->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar18) {
    local_270 = &this->blob_int8scale_table;
    local_278 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_01 = &this->weight_int8scale_table;
    local_280 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_288 = &(this->super_ModelWriter).super_Net.opt;
    uVar17 = 0;
    do {
      iVar13 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar17]->type);
      if ((iVar13 == 0) &&
         (iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::find(&local_270->_M_t,
                          &(((this->super_ModelWriter).layers)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar17]->name),
         iVar14._M_node != local_278)) {
        sprintf(local_138,"%s_param_0",
                ((((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar17]->name)._M_dataplus._M_p);
        local_2e8._0_8_ = local_2e8 + 0x10;
        sVar15 = strlen(local_138);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2e8,local_138,local_138 + sVar15);
        local_290 = this_01;
        iVar16 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::find(&this_01->_M_t,(key_type *)local_2e8);
        if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
          operator_delete((void *)local_2e8._0_8_);
        }
        if (iVar16._M_node == local_280) {
          quantize_convolution();
          return -1;
        }
        pLVar4 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
        __ptr = *(pointer *)(iVar14._M_node + 2);
        p_Var5 = iVar14._M_node[2]._M_parent;
        local_298 = (pointer)iVar14._M_node[2]._M_left;
        uVar1 = *(undefined4 *)&iVar14._M_node[2]._M_right;
        plVar6 = *(long **)(iVar14._M_node + 3);
        local_1d8 = iVar14._M_node[3]._M_parent;
        uStack_1d0 = iVar14._M_node[3]._M_left;
        uVar2 = *(undefined4 *)&iVar14._M_node[3]._M_right;
        local_2a0 = *(undefined8 *)(iVar14._M_node + 4);
        if (p_Var5 != (_Base_ptr)0x0) {
          LOCK();
          p_Var5->_M_color = p_Var5->_M_color + _S_black;
          UNLOCK();
        }
        local_2e8._0_8_ = *(undefined8 *)(iVar16._M_node + 2);
        local_2e8._8_8_ = iVar16._M_node[2]._M_parent;
        local_2e8._16_8_ = iVar16._M_node[2]._M_left;
        local_2e8._24_4_ = *(undefined4 *)&iVar16._M_node[2]._M_right;
        local_2c8 = *(Allocator **)(iVar16._M_node + 3);
        local_2c0 = *(int *)&iVar16._M_node[3]._M_parent;
        iStack_2bc = *(int *)((long)&iVar16._M_node[3]._M_parent + 4);
        iStack_2b8 = *(int *)&iVar16._M_node[3]._M_left;
        iStack_2b4 = *(int *)((long)&iVar16._M_node[3]._M_left + 4);
        local_2b0 = *(int *)&iVar16._M_node[3]._M_right;
        local_2a8 = *(pointer *)(iVar16._M_node + 4);
        if ((_Base_ptr)local_2e8._8_8_ != (_Base_ptr)0x0) {
          LOCK();
          ((_Base_ptr)local_2e8._8_8_)->_M_color = ((_Base_ptr)local_2e8._8_8_)->_M_color + _S_black
          ;
          UNLOCK();
        }
        fprintf(_stderr,"quantize_convolution %s\n",(pLVar4->name)._M_dataplus._M_p);
        iVar13 = *(int *)&pLVar4[1].one_blob_only * *(int *)((long)&pLVar4[1]._vptr_Layer + 4);
        uVar11 = (long)*(int *)((long)&pLVar4[1].type._M_dataplus._M_p + 4) /
                 (long)*(int *)&pLVar4[1]._vptr_Layer;
        this_00 = &pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        ncnn::Mat::reshape(&local_180,(Mat *)this_00,iVar13,
                           (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                       uVar11 & 0xffffffff) / (long)iVar13),
                           *(int *)&pLVar4[1]._vptr_Layer,(Allocator *)0x0);
        local_268.cstep = 0;
        local_268.data = (void *)0x0;
        local_268.refcount._0_4_ = 0;
        local_268.refcount._4_4_ = 0;
        local_268.elemsize._0_4_ = 0;
        local_268._20_8_ = 0;
        local_268.h = 0;
        local_268.d = 0;
        local_268.c = 0;
        local_268.allocator = (Allocator *)0x0;
        local_268.dims = 0;
        local_268.w = 0;
        local_1c8.lightmode = local_288->lightmode;
        local_1c8._1_3_ = *(undefined3 *)&local_288->field_0x1;
        local_1c8.num_threads = local_288->num_threads;
        local_1c8.workspace_allocator = local_288->workspace_allocator;
        local_1c8.openmp_blocktime = local_288->openmp_blocktime;
        local_1c8.use_winograd_convolution = local_288->use_winograd_convolution;
        local_1c8.use_sgemm_convolution = local_288->use_sgemm_convolution;
        local_1c8.use_int8_inference = local_288->use_int8_inference;
        local_1c8.use_vulkan_compute = local_288->use_vulkan_compute;
        uVar11._0_1_ = local_288->use_bf16_storage;
        uVar11._1_1_ = local_288->use_fp16_packed;
        uVar11._2_1_ = local_288->use_fp16_storage;
        uVar11._3_1_ = local_288->use_fp16_arithmetic;
        uVar11._4_1_ = local_288->use_int8_packed;
        uVar11._5_1_ = local_288->use_int8_storage;
        uVar11._6_1_ = local_288->use_int8_arithmetic;
        uVar11._7_1_ = local_288->use_packing_layout;
        local_1c8.use_shader_pack8 = local_288->use_shader_pack8;
        local_1c8.use_subgroup_basic = local_288->use_subgroup_basic;
        local_1c8.use_subgroup_vote = local_288->use_subgroup_vote;
        local_1c8.use_subgroup_ballot = local_288->use_subgroup_ballot;
        local_1c8.use_subgroup_shuffle = local_288->use_subgroup_shuffle;
        local_1c8.use_image_storage = local_288->use_image_storage;
        local_1c8.use_tensor_storage = local_288->use_tensor_storage;
        local_1c8.use_reserved_0 = local_288->use_reserved_0;
        local_1c8.flush_denormals = local_288->flush_denormals;
        local_1c8.use_local_pool_allocator = local_288->use_local_pool_allocator;
        local_1c8.use_shader_local_memory = local_288->use_shader_local_memory;
        local_1c8.use_cooperative_matrix = local_288->use_cooperative_matrix;
        local_1c8.use_winograd23_convolution = local_288->use_winograd23_convolution;
        local_1c8.use_winograd43_convolution = local_288->use_winograd43_convolution;
        local_1c8.use_winograd63_convolution = local_288->use_winograd63_convolution;
        local_1c8.use_reserved_6 = local_288->use_reserved_6;
        local_1c8.use_reserved_7 = local_288->use_reserved_7;
        local_1c8.use_reserved_8 = local_288->use_reserved_8;
        local_1c8.use_reserved_9 = local_288->use_reserved_9;
        local_1c8.use_reserved_10 = local_288->use_reserved_10;
        local_1c8.use_reserved_11 = local_288->use_reserved_11;
        local_1c8.blob_allocator =
             (Allocator *)
             pLVar4[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1c8._32_8_ = uVar11 & 0xffffffffffffff;
        ncnn::quantize_to_int8(&local_180,&local_268,(Mat *)local_2e8,&local_1c8);
        bVar12 = true;
        if ((local_268.data != (void *)0x0) && ((long)local_268.c * local_268.cstep != 0)) {
          ncnn::Mat::reshape(&local_220,&local_268,
                             *(int *)((long)&pLVar4[1].type._M_dataplus._M_p + 4),(Allocator *)0x0);
          if ((Mat *)this_00 != &local_220) {
            if (local_220.refcount != (int *)0x0) {
              LOCK();
              *local_220.refcount = *local_220.refcount + 1;
              UNLOCK();
            }
            piVar7 = pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                piVar8 = pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                pMVar9 = pLVar4[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                if (pMVar9 == (pointer)0x0) {
                  if (piVar8 != (pointer)0x0) {
                    free(piVar8);
                  }
                }
                else {
                  (**(code **)((long)pMVar9->data + 0x18))();
                }
              }
            }
            pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_220.data;
            pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = local_220.refcount;
            *(size_t *)
             &pLVar4[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data = local_220.elemsize;
            *(int *)&pLVar4[1].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_220.elempack;
            pLVar4[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_220.allocator;
            *(int *)&pLVar4[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data = local_220.dims;
            *(int *)((long)&pLVar4[1].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + 4) = local_220.w;
            *(int *)&pLVar4[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish = local_220.h;
            *(int *)((long)&pLVar4[1].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4) = local_220.d;
            *(int *)&pLVar4[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage = local_220.c;
            pLVar4[2]._vptr_Layer = (_func_int **)local_220.cstep;
          }
          if (local_220.refcount != (int *)0x0) {
            LOCK();
            *local_220.refcount = *local_220.refcount + -1;
            UNLOCK();
            if (*local_220.refcount == 0) {
              if ((pointer)local_220.allocator == (pointer)0x0) {
                if ((pointer)local_220.data != (pointer)0x0) {
                  free(local_220.data);
                }
              }
              else {
                (**(code **)((long)(local_220.allocator)->_vptr_Allocator + 0x18))();
              }
            }
          }
          bVar12 = false;
        }
        piVar7 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_268.allocator == (Allocator *)0x0) {
              if (local_268.data != (void *)0x0) {
                free(local_268.data);
              }
            }
            else {
              (*(local_268.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_180.refcount != (int *)0x0) {
          LOCK();
          *local_180.refcount = *local_180.refcount + -1;
          UNLOCK();
          if (*local_180.refcount == 0) {
            if (local_180.allocator == (Allocator *)0x0) {
              if (local_180.data != (void *)0x0) {
                free(local_180.data);
              }
            }
            else {
              (*(local_180.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (!bVar12) {
          *(undefined4 *)&pLVar4[1].type._M_string_length = 2;
          if (&pLVar4[2].name != (string *)local_2e8) {
            if ((_Base_ptr)local_2e8._8_8_ != (_Base_ptr)0x0) {
              LOCK();
              *(_Rb_tree_color *)local_2e8._8_8_ = *(_Rb_tree_color *)local_2e8._8_8_ + _S_black;
              UNLOCK();
            }
            piVar7 = (int *)pLVar4[2].name._M_string_length;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                __ptr_00 = pLVar4[2].name._M_dataplus._M_p;
                plVar10 = *(long **)&pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data;
                if (plVar10 == (long *)0x0) {
                  if (__ptr_00 != (pointer)0x0) {
                    free(__ptr_00);
                  }
                }
                else {
                  (**(code **)(*plVar10 + 0x18))();
                }
              }
            }
            pLVar4[2].name._M_dataplus._M_p = (pointer)local_2e8._0_8_;
            pLVar4[2].name._M_string_length = local_2e8._8_8_;
            pLVar4[2].name.field_2._M_allocated_capacity = local_2e8._16_8_;
            *(undefined4 *)((long)&pLVar4[2].name.field_2 + 8) = local_2e8._24_4_;
            *(Allocator **)
             &pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data = local_2c8;
            *(int *)&pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_2c0;
            *(int *)((long)&pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4) = iStack_2bc;
            *(int *)&pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage = iStack_2b8;
            *(int *)((long)&pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4) = iStack_2b4;
            *(int *)&pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data = local_2b0;
            pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = local_2a8;
          }
          if (p_Var5 != (_Base_ptr)0x0) {
            LOCK();
            p_Var5->_M_color = p_Var5->_M_color + _S_black;
            UNLOCK();
          }
          piVar7 = *(int **)&pLVar4[2].bottom_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              piVar8 = pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              plVar10 = *(long **)&pLVar4[2].top_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data;
              if (plVar10 == (long *)0x0) {
                if (piVar8 != (pointer)0x0) {
                  free(piVar8);
                }
              }
              else {
                (**(code **)(*plVar10 + 0x18))();
              }
            }
          }
          pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = __ptr;
          *(_Base_ptr *)
           &pLVar4[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data = p_Var5;
          pLVar4[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = local_298;
          *(undefined4 *)
           &pLVar4[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = uVar1;
          *(long **)&pLVar4[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data = plVar6;
          *(undefined4 *)
           &pLVar4[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (undefined4)local_1d8;
          *(undefined4 *)
           ((long)&pLVar4[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 4) = local_1d8._4_4_;
          *(undefined4 *)
           &pLVar4[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (undefined4)uStack_1d0;
          *(undefined4 *)
           ((long)&pLVar4[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = uStack_1d0._4_4_;
          *(undefined4 *)&pLVar4[3]._vptr_Layer = uVar2;
          pLVar4[3].one_blob_only = (bool)(undefined1)local_2a0;
          pLVar4[3].support_inplace = (bool)local_2a0._1_1_;
          pLVar4[3].support_vulkan = (bool)local_2a0._2_1_;
          pLVar4[3].support_packing = (bool)local_2a0._3_1_;
          pLVar4[3].support_bf16_storage = (bool)local_2a0._4_1_;
          pLVar4[3].support_fp16_storage = (bool)local_2a0._5_1_;
          pLVar4[3].support_int8_storage = (bool)local_2a0._6_1_;
          pLVar4[3].support_image_storage = (bool)local_2a0._7_1_;
        }
        if ((_Base_ptr)local_2e8._8_8_ != (_Base_ptr)0x0) {
          LOCK();
          *(_Rb_tree_color *)local_2e8._8_8_ = *(_Rb_tree_color *)local_2e8._8_8_ - _S_black;
          UNLOCK();
          if (*(_Rb_tree_color *)local_2e8._8_8_ == _S_red) {
            if (local_2c8 == (Allocator *)0x0) {
              if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
                free((void *)local_2e8._0_8_);
              }
            }
            else {
              (*local_2c8->_vptr_Allocator[3])();
            }
          }
        }
        if (p_Var5 != (_Base_ptr)0x0) {
          LOCK();
          p_Var5->_M_color = p_Var5->_M_color - _S_black;
          UNLOCK();
          if (p_Var5->_M_color == _S_red) {
            if (plVar6 == (long *)0x0) {
              if (__ptr != (pointer)0x0) {
                free(__ptr);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x18))(plVar6,__ptr);
            }
          }
        }
        this_01 = local_290;
        if (bVar12) {
          return -100;
        }
      }
      uVar17 = uVar17 + 1;
    } while ((uVar18 & 0x7fffffff) != uVar17);
  }
  return 0;
}

Assistant:

int NetQuantize::quantize_convolution()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "Convolution")
            continue;

        // find convolution layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // Convolution - quantize weight from fp32 to int8
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_convolution %s\n", convolution->name.c_str());

        {
            const int maxk = convolution->kernel_w * convolution->kernel_h;
            const int num_input = convolution->weight_data_size / convolution->num_output / maxk;

            ncnn::Mat weight_data_r2 = convolution->weight_data.reshape(maxk, num_input, convolution->num_output);

            ncnn::Mat weight_data_int8;

            ncnn::Option opt_q = opt;
            opt_q.blob_allocator = convolution->weight_data.allocator;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            convolution->weight_data = weight_data_int8.reshape(convolution->weight_data_size);
        }

        convolution->int8_scale_term = 2;
        convolution->weight_data_int8_scales = weight_data_int8_scales;
        convolution->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}